

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_connector_tcp.c
# Opt level: O2

void reconnect_close_cb(uv_handle_t *handle)

{
  asterism_tcp_connector_s *obj;
  
  obj = (asterism_tcp_connector_s *)handle[1].u.reserved[1];
  if ((obj->as->field_0x78 & 1) == 0) {
    _asterism_log(ASTERISM_LOG_DEBUG,
                  "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/src/asterism/asterism_connector_tcp.c(40)"
                  ,"connector reconnect");
    asterism_connector_tcp_init(obj->as,obj->host,obj->port);
  }
  connector_delete(obj);
  free(&handle[-1].flags);
  return;
}

Assistant:

static void reconnect_close_cb(
    uv_handle_t *handle)
{
    struct connector_timer_s *timer = __CONTAINER_PTR(struct connector_timer_s, timer, handle);
    struct asterism_tcp_connector_s *connector = timer->connector;

    if (connector->as->stoped != 1)
    {
        asterism_log(ASTERISM_LOG_DEBUG, "connector reconnect");
        asterism_connector_tcp_init(connector->as,
                                    connector->host, connector->port);
    }

    connector_delete(connector);
    AS_FREE(timer);
}